

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerSafe::
SetSecurePendingDataset(std::function<void(ot::commissioner::Error)>,unsigned_int,ot::commissioner::PendingOperationalDataset_const&)
::$_0::~__0(__0 *this)

{
  if (*(void **)(this + 0xe8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0xe8));
  }
  if (*(void **)(this + 200) != (void *)0x0) {
    operator_delete(*(void **)(this + 200));
  }
  if (*(void **)(this + 0xb0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0xb0));
  }
  if (*(void **)(this + 0x98) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x98));
  }
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
           *)(this + 0x80));
  if (*(__0 **)(this + 0x58) != this + 0x68) {
    operator_delete(*(__0 **)(this + 0x58));
  }
  if (*(void **)(this + 0x38) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x38));
  }
  if (*(code **)(this + 0x18) != (code *)0x0) {
    (**(code **)(this + 0x18))(this + 8,this + 8,3);
  }
  return;
}

Assistant:

Error CommissionerSafe::SetSecurePendingDataset(uint32_t aMaxRetrievalTimer, const PendingOperationalDataset &aDataset)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error aError) { pro.set_value(aError); };

    SetSecurePendingDataset(wait, aMaxRetrievalTimer, aDataset);
    return pro.get_future().get();
}